

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_valueAssignmentForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_valueAssignmentForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  bool *pbVar3;
  char *in_R9;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48 [3];
  Message local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  opt_type o;
  optTyped_valueAssignmentForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
  *this_local;
  
  mp::opt<bool,_mp::opt_default_policy<bool>_>::opt<const_bool_&,_true,_true>
            ((opt<bool,_mp::opt_default_policy<bool>_> *)((long)&gtest_ar_.message_.ptr_ + 7),
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2);
  mp::opt<bool,_mp::opt_default_policy<bool>_>::opt<const_bool_&,_true,_true>
            ((opt<bool,_mp::opt_default_policy<bool>_> *)((long)&gtest_ar_.message_.ptr_ + 6),
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1);
  gtest_ar_.message_.ptr_._7_1_ = gtest_ar_.message_.ptr_._6_1_;
  testing::AssertionResult::AssertionResult<mp::opt<bool,mp::opt_default_policy<bool>>>
            ((AssertionResult *)local_28,
             (opt<bool,_mp::opt_default_policy<bool>_> *)((long)&gtest_ar_.message_.ptr_ + 7),
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,(AssertionResult *)0x20ac7e,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x315,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_79 = mp::opt<bool,_mp::opt_default_policy<bool>_>::has_value
                       ((opt<bool,_mp::opt_default_policy<bool>_> *)
                        ((long)&gtest_ar_.message_.ptr_ + 7));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_78,(AssertionResult *)0x20a70d,"false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x316,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pbVar3 = mp::opt<bool,_mp::opt_default_policy<bool>_>::operator*
                     ((opt<bool,_mp::opt_default_policy<bool>_> *)
                      ((long)&gtest_ar_.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_c0,"this->value_1","*o",
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1,pbVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x317,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  pbVar3 = mp::opt<bool,_mp::opt_default_policy<bool>_>::value
                     ((opt<bool,_mp::opt_default_policy<bool>_> *)
                      ((long)&gtest_ar_.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_e0,"this->value_1","o.value()",
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1,pbVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x318,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_101 = mp::opt<bool,mp::opt_default_policy<bool>>::value_or<bool_const&>
                        ((opt<bool,mp::opt_default_policy<bool>> *)
                         ((long)&gtest_ar_.message_.ptr_ + 7),
                         &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).
                          value_2);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_100,"this->value_1","o.value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1,
             &local_101);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x319,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  return;
}

Assistant:

TYPED_TEST(optTyped, valueAssignmentForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o{this->value_2};
  o = this->value_1;
  EXPECT_TRUE(o);
  EXPECT_TRUE(o.has_value());
  EXPECT_EQ(this->value_1, *o);
  EXPECT_EQ(this->value_1, o.value());
  EXPECT_EQ(this->value_1, o.value_or(this->value_2));
}